

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.h
# Opt level: O2

int __thiscall Move::input_move(Move *this)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  istream *piVar5;
  long *plVar6;
  size_type sVar7;
  int p;
  int j;
  int i;
  string ss;
  string acr;
  string sss;
  stringstream line;
  
  sss._M_dataplus._M_p = (pointer)&sss.field_2;
  sss._M_string_length = 0;
  sss.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&sss);
  std::__cxx11::stringstream::stringstream((stringstream *)&line,(string *)&sss,_S_out|_S_in);
  ss._M_dataplus._M_p = (pointer)&ss.field_2;
  ss._M_string_length = 0;
  iVar4 = 0;
  ss.field_2._M_local_buf[0] = '\0';
  acr._M_dataplus._M_p = (pointer)&acr.field_2;
  acr._M_string_length = 0;
  acr.field_2._M_local_buf[0] = '\0';
  piVar5 = std::operator>>((istream *)&line,(string *)&ss);
  if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
    bVar3 = std::operator==(&ss,".");
    if (bVar3) {
      iVar4 = -1;
    }
    else {
      bVar3 = std::operator==(&ss,"!");
      if (bVar3) {
        std::operator>>((istream *)&line,(string *)&this->swap_letters);
        iVar4 = 2;
      }
      else {
        plVar6 = (long *)std::istream::operator>>((istream *)&line,&i);
        if (((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) ||
           (plVar6 = (long *)std::istream::operator>>((istream *)&line,&j),
           (*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0)) {
          j = (this->bsize + 1) / 2;
          i = j;
        }
        piVar5 = std::operator>>((istream *)&line,(string *)&acr);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
          std::__cxx11::string::assign((char *)&acr);
        }
        plVar6 = (long *)std::istream::operator>>((istream *)&line,&p);
        sVar2 = ss._M_string_length;
        _Var1 = ss._M_dataplus;
        if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
          p = -1;
        }
        for (sVar7 = 0; sVar2 != sVar7; sVar7 = sVar7 + 1) {
          iVar4 = toupper((int)_Var1._M_p[sVar7]);
          _Var1._M_p[sVar7] = (char)iVar4;
        }
        set_all(this,&ss,i,j,*acr._M_dataplus._M_p != 'd',0,p,0);
        iVar4 = 1;
      }
    }
  }
  std::__cxx11::string::~string((string *)&acr);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::stringstream::~stringstream((stringstream *)&line);
  std::__cxx11::string::~string((string *)&sss);
  return iVar4;
}

Assistant:

int input_move() {
        std::string sss;
        getline(std::cin, sss);
        std::stringstream line{sss};
        int i, j, p;
        std::string ss, acr;
        if (!(line >> ss)) return 0;
        if (ss == ".") return -1;
        if (ss == "!") {
            line >> this->swap_letters;
            return 2;
        }
        if (!(line >> i) || !(line >> j)) i = j = (bsize + 1) / 2;
        if (!(line >> acr)) acr = "a";
        if (!(line >> p)) p = -1;

        for (char &c:ss) c = toupper(c);
        set_all(ss, i, j, acr[0] != 'd', 0, p);
        return 1;
    }